

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::ShiftHelper<double>(JavascriptArray *pArr,ScriptContext *scriptContext)

{
  Type *addr;
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *seg;
  Recycler *recycler;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  SparseArraySegmentBase *pSVar10;
  uint32 maxValue;
  
  pSVar2 = (pArr->head).ptr;
  seg = (pSVar2->next).ptr;
  if (seg != (SparseArraySegmentBase *)0x0) {
    recycler = scriptContext->recycler;
    addr = &pArr->head;
    pSVar10 = seg;
    do {
      pSVar10->left = pSVar10->left - 1;
      pSVar10 = (pSVar10->next).ptr;
    } while (pSVar10 != (SparseArraySegmentBase *)0x0);
    if (pSVar2->size <= seg->left) goto LAB_00b9d8da;
    if (pSVar2->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1722,"(pArr->head->left == 0)",
                                  "Array always points to a head starting at index 0");
      if (!bVar5) goto LAB_00b9d8f4;
      *puVar9 = 0;
    }
    if (addr->ptr->size != seg->left + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1723,"(pArr->head->size == next->left + 1)",
                                  "Shift next->left overlaps current segment by more than 1 element"
                                 );
      if (!bVar5) goto LAB_00b9d8f4;
      *puVar9 = 0;
    }
    pSVar2 = (pArr->head).ptr;
    bVar5 = IsInlineSegment(pSVar2,pArr);
    bVar6 = IsInlineSegment(seg,pArr);
    pSVar10 = pSVar2;
    if (seg->length != 0) {
      uVar8 = pSVar2->size;
      pSVar3 = (seg->next).ptr;
      if (pSVar3 == (SparseArraySegmentBase *)0x0) {
        pSVar10 = &SparseArraySegment<double>::GrowByMin
                             ((SparseArraySegment<double> *)pSVar2,recycler,seg->length - 1)->
                   super_SparseArraySegmentBase;
      }
      else {
        if (pSVar3->left < uVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1737,"(next->next->left >= head->size)",
                                      "next->next->left >= head->size");
          if (!bVar7) goto LAB_00b9d8f4;
          *puVar9 = 0;
        }
        maxValue = ((seg->next).ptr)->left - pSVar2->size;
        if (maxValue == 0) {
          if (seg->length != 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x1740,"(next->length == 1)","next->length == 1");
            if (!bVar7) {
LAB_00b9d8f4:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar9 = 0;
          }
        }
        else {
          pSVar10 = &SparseArraySegment<double>::GrowByMinMax
                               ((SparseArraySegment<double> *)pSVar2,recycler,seg->length - 1,
                                maxValue)->super_SparseArraySegmentBase;
        }
      }
      uVar8 = uVar8 - 1;
      uVar1 = seg->length;
      memmove_xplat(&pSVar10[1].left + (ulong)uVar8 * 2,seg + 1,(ulong)uVar1 * 8);
      if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015d641c) == 1) {
        (*g_verifyIsNotBarrierAddress)(&pSVar10[1].left + (ulong)uVar8 * 2,(ulong)uVar1);
      }
      pSVar10->length = uVar8 + seg->length;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar10);
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if (bVar5 && pSVar2 != pSVar10) {
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (pArr,pSVar2,0);
      }
    }
    pSVar2 = (seg->next).ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar10->next);
    (pSVar10->next).ptr = pSVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar10->next);
    if (bVar6) {
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,seg,0);
    }
    SetLastUsedSegment(pArr,(pArr->head).ptr);
    ClearSegmentMap(pArr);
  }
LAB_00b9d8da:
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pArr);
  return;
}

Assistant:

void JavascriptArray::ShiftHelper(JavascriptArray* pArr, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();

        SparseArraySegment<T>* next = SparseArraySegment<T>::From(pArr->head->next);
        while (next)
        {
            next->left--;
            next = SparseArraySegment<T>::From(next->next);
        }

        // head and next might overlap as the next segment left is decremented
        next = SparseArraySegment<T>::From(pArr->head->next);
        if (next && (pArr->head->size > next->left))
        {
            AssertMsg(pArr->head->left == 0, "Array always points to a head starting at index 0");
            AssertMsg(pArr->head->size == next->left + 1, "Shift next->left overlaps current segment by more than 1 element");

            SparseArraySegment<T> *head = SparseArraySegment<T>::From(pArr->head);
            SparseArraySegment<T> *oldHead = head;
            bool isInlineSegment = JavascriptArray::IsInlineSegment(head, pArr);
            bool nextIsInlineSegment = JavascriptArray::IsInlineSegment(next, pArr);
            // Merge the two adjacent segments
            if (next->length != 0)
            {
                uint32 offset = head->size - 1;
                // There is room for one unshifted element in head segment.
                // Hence it's enough if we grow the head segment by next->length - 1

                if (next->next)
                {
                    // If we have a next->next, we can't grow pass the left of that

                    // If the array had a segment map before, the next->next might just be right after next as well.
                    // So we just need to grow to the end of the next segment
                    // TODO: merge that segment too?
                    Assert(next->next->left >= head->size);
                    uint32 maxGrowSize = next->next->left - head->size;
                    if (maxGrowSize != 0)
                    {
                        head = head->GrowByMinMax(recycler, next->length - 1, maxGrowSize); //-1 is to account for unshift
                    }
                    else
                    {
                        // The next segment is only of length one, so we already have space in the header to copy that
                        Assert(next->length == 1);
                    }
                }
                else
                {
                    head = head->GrowByMin(recycler, next->length - 1); //-1 is to account for unshift
                }
                MoveArray(head->elements + offset, next->elements, next->length);
                head->length = offset + next->length;
                head->CheckLengthvsSize();
                pArr->head = head;

                if (isInlineSegment && oldHead != head)
                {
                    pArr->ClearElements(oldHead, 0);
                }
            }
            head->next = next->next;
            if (nextIsInlineSegment)
            {
                pArr->ClearElements(next, 0);
            }

            pArr->InvalidateLastUsedSegment();
            pArr->ClearSegmentMap();
        }

#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif
    }